

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

GLFWbool acquireMonitor(_GLFWwindow *window)

{
  GLFWbool GVar1;
  int ypos;
  int xpos;
  GLFWvidmode mode;
  int local_50;
  int local_4c;
  GLFWvidmode local_48;
  
  if (_glfw.x11.saver.count == 0) {
    XGetScreenSaver(_glfw.x11.display,0x1bff54,0x1bff58,0x1bff5c,0x1bff60);
    XSetScreenSaver(_glfw.x11.display,0,0,0,2);
  }
  if (window->monitor->window == (_GLFWwindow *)0x0) {
    _glfw.x11.saver.count = _glfw.x11.saver.count + 1;
  }
  GVar1 = _glfwSetVideoModeX11(window->monitor,&window->videoMode);
  if ((window->x11).overrideRedirect != 0) {
    _glfwPlatformGetMonitorPos(window->monitor,&local_4c,&local_50);
    _glfwPlatformGetVideoMode(window->monitor,&local_48);
    XMoveResizeWindow(_glfw.x11.display,(window->x11).handle,local_4c,local_50,local_48.width,
                      local_48.height);
  }
  _glfwInputMonitorWindowChange(window->monitor,window);
  return GVar1;
}

Assistant:

static GLFWbool acquireMonitor(_GLFWwindow* window)
{
    GLFWbool status;

    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    if (!window->monitor->window)
        _glfw.x11.saver.count++;

    status = _glfwSetVideoModeX11(window->monitor, &window->videoMode);

    if (window->x11.overrideRedirect)
    {
        int xpos, ypos;
        GLFWvidmode mode;

        // Manually position the window over its monitor
        _glfwPlatformGetMonitorPos(window->monitor, &xpos, &ypos);
        _glfwPlatformGetVideoMode(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    _glfwInputMonitorWindowChange(window->monitor, window);
    return status;
}